

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O0

size_t __thiscall nuraft::timer_helper::get_duration_us(timer_helper *this)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> l;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[1]._M_device;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x21be99);
  return (size_t)pmVar1;
}

Assistant:

size_t get_duration_us() const {
        std::lock_guard<std::mutex> l(lock_);
        return duration_us_;
    }